

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::VersionUpdate(CClient *this)

{
  undefined4 Token;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar7;
  long lVar1;
  undefined1 uVar9;
  undefined8 uVar2;
  uint uVar10;
  int iVar11;
  IEngine *pIVar12;
  CConfig *pCVar13;
  CClient *in_RDI;
  long in_FS_OFFSET;
  CNetChunk Packet;
  uint in_stack_ffffffffffffff9c;
  void *in_stack_ffffffffffffffa0;
  CClient *pCallbackData;
  undefined4 uVar4;
  undefined3 uVar6;
  undefined2 uVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_VersionInfo).m_State == 0) {
    pIVar12 = Engine(in_RDI);
    pCVar13 = Config(in_RDI);
    uVar10 = CNetBase::NetType(&(in_RDI->m_ContactClient).super_CNetBase);
    (*(pIVar12->super_IInterface)._vptr_IInterface[6])
              (pIVar12,&(in_RDI->m_VersionInfo).m_VersionServeraddr,pCVar13->m_ClVersionServer,
               (ulong)uVar10);
    (in_RDI->m_VersionInfo).m_State = 1;
  }
  else if (((in_RDI->m_VersionInfo).m_State == 1) &&
          (pCallbackData = in_RDI,
          iVar11 = CJob::Status(&(in_RDI->m_VersionInfo).m_VersionServeraddr.m_Job), iVar11 == 2)) {
    iVar11 = CJob::Result(&(in_RDI->m_VersionInfo).m_VersionServeraddr.m_Job);
    if (iVar11 == 0) {
      mem_zero(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      (in_RDI->m_VersionInfo).m_VersionServeraddr.m_Addr.port = 0x205d;
      Token = (in_RDI->m_VersionInfo).m_VersionServeraddr.m_Addr.type;
      uVar3 = (in_RDI->m_VersionInfo).m_VersionServeraddr.m_Addr.ip[0];
      uVar5 = (in_RDI->m_VersionInfo).m_VersionServeraddr.m_Addr.ip[1];
      uVar7 = (in_RDI->m_VersionInfo).m_VersionServeraddr.m_Addr.ip[2];
      uVar9 = (in_RDI->m_VersionInfo).m_VersionServeraddr.m_Addr.ip[3];
      uVar8 = CONCAT11(uVar9,uVar7);
      uVar6 = CONCAT21(uVar8,uVar5);
      uVar4 = CONCAT31(uVar6,uVar3);
      uVar2 = *(undefined8 *)((in_RDI->m_VersionInfo).m_VersionServeraddr.m_Addr.ip + 4);
      CNetClient::Send((CNetClient *)
                       CONCAT44((int)*(undefined8 *)
                                      ((in_RDI->m_VersionInfo).m_VersionServeraddr.m_Addr.ip + 0xc),
                                (int)((ulong)uVar2 >> 0x20)),(CNetChunk *)CONCAT44((int)uVar2,uVar4)
                       ,Token,(CSendCBData *)pCallbackData);
      (in_RDI->m_VersionInfo).m_State = 2;
    }
    else {
      (in_RDI->m_VersionInfo).m_State = 3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CClient::VersionUpdate()
{
	if(m_VersionInfo.m_State == CVersionInfo::STATE_INIT)
	{
		Engine()->HostLookup(&m_VersionInfo.m_VersionServeraddr, Config()->m_ClVersionServer, m_ContactClient.NetType());
		m_VersionInfo.m_State = CVersionInfo::STATE_START;
	}
	else if(m_VersionInfo.m_State == CVersionInfo::STATE_START)
	{
		if(m_VersionInfo.m_VersionServeraddr.m_Job.Status() == CJob::STATE_DONE)
		{
			if(m_VersionInfo.m_VersionServeraddr.m_Job.Result() == 0)
			{
				CNetChunk Packet;

				mem_zero(&Packet, sizeof(Packet));

				m_VersionInfo.m_VersionServeraddr.m_Addr.port = VERSIONSRV_PORT;

				Packet.m_ClientID = -1;
				Packet.m_Address = m_VersionInfo.m_VersionServeraddr.m_Addr;
				Packet.m_pData = VERSIONSRV_GETVERSION;
				Packet.m_DataSize = sizeof(VERSIONSRV_GETVERSION);
				Packet.m_Flags = NETSENDFLAG_CONNLESS;

				m_ContactClient.Send(&Packet);
				m_VersionInfo.m_State = CVersionInfo::STATE_READY;
			}
			else
				m_VersionInfo.m_State = CVersionInfo::STATE_ERROR;
		}
	}
}